

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O3

FT_Module_Interface cff_get_interface(FT_Module driver,char *module_interface)

{
  FT_Module_Interface pvVar1;
  FT_Module pFVar2;
  
  pvVar1 = ft_service_list_lookup(cff_services,module_interface);
  if (pvVar1 == (FT_Pointer)0x0) {
    if ((driver != (FT_Module)0x0) && (driver->library != (FT_Library)0x0)) {
      pFVar2 = FT_Get_Module(driver->library,"sfnt");
      if (pFVar2 != (FT_Module)0x0) {
        pvVar1 = (*pFVar2->clazz->get_interface)(pFVar2,module_interface);
        return pvVar1;
      }
    }
    pvVar1 = (FT_Module_Interface)0x0;
  }
  return pvVar1;
}

Assistant:

FT_CALLBACK_DEF( FT_Module_Interface )
  cff_get_interface( FT_Module    driver,       /* CFF_Driver */
                     const char*  module_interface )
  {
    FT_Library           library;
    FT_Module            sfnt;
    FT_Module_Interface  result;


    /* CFF_SERVICES_GET dereferences `library' in PIC mode */
#ifdef FT_CONFIG_OPTION_PIC
    if ( !driver )
      return NULL;
    library = driver->library;
    if ( !library )
      return NULL;
#endif

    result = ft_service_list_lookup( CFF_SERVICES_GET, module_interface );
    if ( result )
      return result;

    /* `driver' is not yet evaluated in non-PIC mode */
#ifndef FT_CONFIG_OPTION_PIC
    if ( !driver )
      return NULL;
    library = driver->library;
    if ( !library )
      return NULL;
#endif

    /* we pass our request to the `sfnt' module */
    sfnt = FT_Get_Module( library, "sfnt" );

    return sfnt ? sfnt->clazz->get_interface( sfnt, module_interface ) : 0;
  }